

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetDebugGeneratorExpressions
          (string *__return_storage_ptr__,cmTarget *this,string *value,cmTargetLinkLibraryType llt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr___00;
  bool bVar1;
  cmake *this_00;
  reference __rhs;
  size_type sVar2;
  reference __rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  const_iterator li;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string configString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmTargetLinkLibraryType llt_local;
  string *value_local;
  cmTarget *this_local;
  
  if (llt == GENERAL_LibraryType) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
    __return_storage_ptr___00 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&configString.field_2 + 8);
    cmake::GetDebugConfigs_abi_cxx11_(__return_storage_ptr___00,this_00);
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](__return_storage_ptr___00,0);
    std::operator+(&local_80,"$<CONFIG:",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_80,">");
    std::__cxx11::string::~string((string *)&local_80);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&configString.field_2 + 8));
    if (1 < sVar2) {
      local_a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&configString.field_2 + 8));
      local_a0 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator+(&local_a8,1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_98,&local_a0);
      while( true ) {
        local_b0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&configString.field_2 + 8));
        bVar1 = __gnu_cxx::operator!=(&local_98,&local_b0);
        if (!bVar1) break;
        __rhs_00 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_98);
        std::operator+(&local_f0,",$<CONFIG:",__rhs_00);
        std::operator+(&local_d0,&local_f0,">");
        std::__cxx11::string::operator+=((string *)local_60,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_98);
      }
      std::operator+(&local_130,"$<OR:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_110,&local_130,">");
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
    }
    if (llt == OPTIMIZED_LibraryType) {
      std::operator+(&local_170,"$<NOT:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_150,&local_170,">");
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::operator+(&local_1d0,"$<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::operator+(&local_1b0,&local_1d0,":");
    std::operator+(&local_190,&local_1b0,value);
    std::operator+(__return_storage_ptr__,&local_190,">");
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&configString.field_2 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetDebugGeneratorExpressions(const std::string &value,
                                  cmTargetLinkLibraryType llt) const
{
  if (llt == GENERAL_LibraryType)
    {
    return value;
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
                      this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  std::string configString = "$<CONFIG:" + debugConfigs[0] + ">";

  if (debugConfigs.size() > 1)
    {
    for(std::vector<std::string>::const_iterator
          li = debugConfigs.begin() + 1; li != debugConfigs.end(); ++li)
      {
      configString += ",$<CONFIG:" + *li + ">";
      }
    configString = "$<OR:" + configString + ">";
    }

  if (llt == OPTIMIZED_LibraryType)
    {
    configString = "$<NOT:" + configString + ">";
    }
  return "$<" + configString + ":" + value + ">";
}